

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyCleanWord2000(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  Lexer *lexer;
  TidyTagId TVar2;
  Bool BVar3;
  AttVal *pAVar4;
  Node *node_00;
  AttVal *pAVar5;
  ctmbstr ptVar6;
  Dict *pDVar7;
  Node *pNVar8;
  int iVar9;
  Node *node_01;
  Node *local_48;
  uint local_3c;
  Node *next;
  
  lexer = doc->lexer;
  local_48 = (Node *)0x0;
LAB_0013481b:
  do {
    if (node == (Node *)0x0) {
      return;
    }
    node_01 = node;
    if (node->tag != (Dict *)0x0) {
      TVar2 = node->tag->id;
      if (TVar2 == TidyTag_HTML) {
        pAVar4 = prvTidyGetAttrByName(node,"xmlns:o");
        if ((pAVar4 == (AttVal *)0x0) && (*(int *)((doc->config).value + 0x1f) == 0)) {
          return;
        }
        prvTidyFreeAttrs(doc,node);
        if (node->tag == (Dict *)0x0) goto LAB_00134920;
        TVar2 = node->tag->id;
      }
      if ((TVar2 == TidyTag_P) && (BVar3 = NoMargins(node), BVar3 != no)) {
        prvTidyCoerceNode(doc,node,TidyTag_PRE,no,yes);
        PurgeWord2000Attributes(doc,node);
        if (node->content != (Node *)0x0) {
          prvTidyCleanWord2000(doc,node->content);
        }
        node_01 = node->next;
        while( true ) {
          if (node_01 == (Node *)0x0) {
            return;
          }
          if (((node_01->tag == (Dict *)0x0) || (node_01->tag->id != TidyTag_P)) ||
             (BVar3 = NoMargins(node_01), BVar3 == no)) break;
          pNVar8 = node_01->next;
          prvTidyRemoveNode(node_01);
          node_00 = prvTidyNewLineNode(lexer);
          prvTidyInsertNodeAtEnd(node,node_00);
          prvTidyInsertNodeAtEnd(node,node_01);
          StripSpan(doc,node_01);
          node_01 = pNVar8;
        }
      }
    }
LAB_00134920:
    pDVar7 = node_01->tag;
    if (pDVar7 != (Dict *)0x0) {
      if ((((pDVar7->model & 8) != 0) && (pNVar8 = node_01->content, pNVar8 != (Node *)0x0)) &&
         ((pNVar8->next == (Node *)0x0 && (pNVar8->type == TextNode)))) {
        uVar1 = pNVar8->start;
        iVar9 = pNVar8->end - uVar1;
        if (iVar9 == 2) {
          local_3c = 0;
          prvTidyGetUTF8(lexer->lexbuf + uVar1,&local_3c);
          if (local_3c != 0xa0) {
            pDVar7 = node_01->tag;
            if (pDVar7 == (Dict *)0x0) goto LAB_0013499a;
            goto LAB_0013498c;
          }
        }
        else if ((iVar9 != 1) || (lexer->lexbuf[uVar1] != ' ')) goto LAB_0013498c;
        goto LAB_001349cd;
      }
LAB_0013498c:
      if ((pDVar7->id != TidyTag_META) && (pDVar7->id != TidyTag_STYLE)) goto LAB_0013499c;
LAB_001349a4:
      node = prvTidyDiscardElement(doc,node_01);
      goto LAB_0013481b;
    }
LAB_0013499a:
    pDVar7 = (Dict *)0x0;
LAB_0013499c:
    if (node_01->type == CommentTag) goto LAB_001349a4;
    if (pDVar7 == (Dict *)0x0) {
LAB_00134a09:
      if ((node_01->tag == (Dict *)0x0) ||
         (iVar9 = prvTidytmbstrcmp(node_01->tag->name,"o:p"), iVar9 != 0)) {
        if (node_01->content == (Node *)0x0) {
          if ((node_01->tag != (Dict *)0x0) && (node_01->tag->id == TidyTag_P)) {
            node = prvTidyTrimEmptyElement(doc,node_01);
            goto LAB_0013481b;
          }
LAB_00134be0:
          local_48 = (Node *)0x0;
        }
        else {
          if ((node_01->tag == (Dict *)0x0) || (node_01->tag->id != TidyTag_P)) goto LAB_00134be0;
          pAVar4 = prvTidyAttrGetById(node_01,TidyAttr_CLASS);
          pAVar5 = prvTidyAttrGetById(node_01,TidyAttr_STYLE);
          if (((pAVar4 == (AttVal *)0x0) || (pAVar4->value == (ctmbstr)0x0)) ||
             ((iVar9 = prvTidytmbstrcasecmp(pAVar4->value,"MsoListBullet"), iVar9 != 0 &&
              ((pAVar4->value == (ctmbstr)0x0 ||
               (iVar9 = prvTidytmbstrcasecmp(pAVar4->value,"MsoListNumber"), iVar9 != 0)))))) {
            if ((pAVar5 != (AttVal *)0x0) &&
               ((pAVar5->value != (ctmbstr)0x0 &&
                (ptVar6 = prvTidytmbsubstr(pAVar5->value,"mso-list:"), ptVar6 != (ctmbstr)0x0)))) {
              TVar2 = TidyTag_UL;
              if (pAVar4 != (AttVal *)0x0) goto LAB_00134b12;
              goto LAB_00134b35;
            }
            if (((pAVar4 == (AttVal *)0x0) || (pAVar4->value == (ctmbstr)0x0)) ||
               (iVar9 = prvTidytmbstrcasecmp(pAVar4->value,"Code"), iVar9 != 0)) goto LAB_00134be0;
            pNVar8 = prvTidyNewLineNode(lexer);
            prvTidyNormalizeSpaces(lexer,node_01->content);
            if (((local_48 == (Node *)0x0) || (local_48->tag == (Dict *)0x0)) ||
               (local_48->tag->id != TidyTag_PRE)) {
              local_48 = prvTidyInferredTag(doc,TidyTag_PRE);
              prvTidyInsertNodeBeforeElement(node_01,local_48);
            }
            prvTidyRemoveNode(node_01);
            prvTidyInsertNodeAtEnd(local_48,node_01);
            StripSpan(doc,node_01);
            prvTidyInsertNodeAtEnd(local_48,pNVar8);
            node_01 = local_48->next;
          }
          else {
LAB_00134b12:
            TVar2 = TidyTag_UL;
            if (pAVar4->value != (ctmbstr)0x0) {
              iVar9 = prvTidytmbstrcasecmp(pAVar4->value,"MsoListNumber");
              TVar2 = TidyTag_UL;
              if (iVar9 == 0) {
                TVar2 = TidyTag_OL;
              }
            }
LAB_00134b35:
            prvTidyCoerceNode(doc,node_01,TidyTag_LI,no,yes);
            if (((local_48 == (Node *)0x0) || (local_48->tag == (Dict *)0x0)) ||
               (local_48->tag->id != TVar2)) {
              pDVar7 = prvTidyLookupTagDef(TVar2);
              local_48 = prvTidyInferredTag(doc,pDVar7->id);
              prvTidyInsertNodeBeforeElement(node_01,local_48);
            }
            PurgeWord2000Attributes(doc,node_01);
            if (node_01->content != (Node *)0x0) {
              prvTidyCleanWord2000(doc,node_01->content);
            }
            prvTidyRemoveNode(node_01);
            prvTidyInsertNodeAtEnd(local_48,node_01);
            node_01 = local_48;
          }
          if (node_01 == (Node *)0x0) {
            return;
          }
        }
        BVar3 = prvTidynodeIsElement(node_01);
        if (BVar3 != no) {
          PurgeWord2000Attributes(doc,node_01);
        }
        if (node_01->content != (Node *)0x0) {
          prvTidyCleanWord2000(doc,node_01->content);
        }
        node = node_01->next;
        goto LAB_0013481b;
      }
      DiscardContainer(doc,node_01,&next);
      node = next;
      goto LAB_0013481b;
    }
    TVar2 = pDVar7->id;
    if (TVar2 != TidyTag_SPAN) {
      if (TVar2 == TidyTag_LINK) {
        pAVar4 = prvTidyAttrGetById(node_01,TidyAttr_REL);
        if (((pAVar4 != (AttVal *)0x0) && (pAVar4->value != (ctmbstr)0x0)) &&
           (iVar9 = prvTidytmbstrcasecmp(pAVar4->value,"File-List"), iVar9 == 0)) goto LAB_001349a4;
      }
      else if (TVar2 == TidyTag_FONT) goto LAB_001349cd;
      goto LAB_00134a09;
    }
LAB_001349cd:
    node = StripSpan(doc,node_01);
  } while( true );
}

Assistant:

void TY_(CleanWord2000)( TidyDocImpl* doc, Node *node)
{
    /* used to a list from a sequence of bulletted p's */
    Lexer* lexer = doc->lexer;
    Node* list = NULL;

    while ( node )
    {
        /* get rid of Word's xmlns attributes */
        if ( nodeIsHTML(node) )
        {
            /* check that it's a Word 2000 document */
            if ( !TY_(GetAttrByName)(node, "xmlns:o") &&
                 !cfgBool(doc, TidyMakeBare) )
                return;

            TY_(FreeAttrs)( doc, node );
        }

        /* fix up preformatted sections by looking for a
        ** sequence of paragraphs with zero top/bottom margin
        */
        if ( nodeIsP(node) )
        {
            if (NoMargins(node))
            {
                Node *pre, *next;
                TY_(CoerceNode)(doc, node, TidyTag_PRE, no, yes);

                PurgeWord2000Attributes( doc, node );

                if (node->content)
                    TY_(CleanWord2000)( doc, node->content );

                pre = node;
                node = node->next;

                /* continue to strip p's */

                while ( nodeIsP(node) && NoMargins(node) )
                {
                    next = node->next;
                    TY_(RemoveNode)(node);
                    TY_(InsertNodeAtEnd)(pre, TY_(NewLineNode)(lexer));
                    TY_(InsertNodeAtEnd)(pre, node);
                    StripSpan( doc, node );
                    node = next;
                }

                if (node == NULL)
                    break;
            }
        }

        if (node->tag && (node->tag->model & CM_BLOCK)
            && SingleSpace(lexer, node))
        {
            node = StripSpan( doc, node );
            continue;
        }
        /* discard Word's style verbiage */
        if ( nodeIsSTYLE(node) || nodeIsMETA(node) ||
             node->type == CommentTag )
        {
            node = TY_(DiscardElement)( doc, node );
            continue;
        }

        /* strip out all span and font tags Word scatters so liberally! */
        if ( nodeIsSPAN(node) || nodeIsFONT(node) )
        {
            node = StripSpan( doc, node );
            continue;
        }

        if ( nodeIsLINK(node) )
        {
            AttVal *attr = TY_(AttrGetById)(node, TidyAttr_REL);

            if (AttrValueIs(attr, "File-List"))
            {
                node = TY_(DiscardElement)( doc, node );
                continue;
            }
        }

        /* discards <o:p> which encodes the paragraph mark */
        if ( node->tag && TY_(tmbstrcmp)(node->tag->name,"o:p")==0)
        {
            Node* next;
            DiscardContainer( doc, node, &next );
            node = next;
            continue;
        }

        /* discard empty paragraphs */

        if ( node->content == NULL && nodeIsP(node) )
        {
            /*  Use the existing function to ensure consistency */
            Node *next = TY_(TrimEmptyElement)( doc, node );
            node = next;
            continue;
        }

        if ( nodeIsP(node) )
        {
            AttVal *attr, *atrStyle;
            
            attr = TY_(AttrGetById)(node, TidyAttr_CLASS);
            atrStyle = TY_(AttrGetById)(node, TidyAttr_STYLE);
            /*
               (JES) Sometimes Word marks a list item with the following hokie syntax
               <p class="MsoNormal" style="...;mso-list:l1 level1 lfo1;
                translate these into <li>
            */
            /* map sequence of <p class="MsoListBullet"> to <ul>...</ul> */
            /* map <p class="MsoListNumber"> to <ol>...</ol> */
            if ( AttrValueIs(attr, "MsoListBullet") ||
                 AttrValueIs(attr, "MsoListNumber") ||
                 AttrContains(atrStyle, "mso-list:") )
            {
                TidyTagId listType = TidyTag_UL;
                if (AttrValueIs(attr, "MsoListNumber"))
                    listType = TidyTag_OL;

                TY_(CoerceNode)(doc, node, TidyTag_LI, no, yes);

                if ( !list || TagId(list) != listType )
                {
                    const Dict* tag = TY_(LookupTagDef)( listType );
                    list = TY_(InferredTag)(doc, tag->id);
                    TY_(InsertNodeBeforeElement)(node, list);
                }

                PurgeWord2000Attributes( doc, node );

                if ( node->content )
                    TY_(CleanWord2000)( doc, node->content );

                /* remove node and append to contents of list */
                TY_(RemoveNode)(node);
                TY_(InsertNodeAtEnd)(list, node);
                node = list;
            }
            /* map sequence of <p class="Code"> to <pre>...</pre> */
            else if (AttrValueIs(attr, "Code"))
            {
                Node *br = TY_(NewLineNode)(lexer);
                TY_(NormalizeSpaces)(lexer, node->content);

                if ( !list || TagId(list) != TidyTag_PRE )
                {
                    list = TY_(InferredTag)(doc, TidyTag_PRE);
                    TY_(InsertNodeBeforeElement)(node, list);
                }

                /* remove node and append to contents of list */
                TY_(RemoveNode)(node);
                TY_(InsertNodeAtEnd)(list, node);
                StripSpan( doc, node );
                TY_(InsertNodeAtEnd)(list, br);
                node = list->next;
            }
            else
                list = NULL;
        }
        else
            list = NULL;

        if (!node)
            return;

        /* strip out style and class attributes */
        if (TY_(nodeIsElement)(node))
            PurgeWord2000Attributes( doc, node );

        if (node->content)
            TY_(CleanWord2000)( doc, node->content );

        node = node->next;
    }
}